

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mostream.hh
# Opt level: O1

void __thiscall OpenMesh::multiplex_streambuf::multiplex_streambuf(multiplex_streambuf *this)

{
  _Rb_tree_header *p_Var1;
  
  *(code **)this = __assert_fail;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__multiplex_streambuf_001c3bd8;
  (this->targets_).
  super__Vector_base<OpenMesh::basic_multiplex_target_*,_std::allocator<OpenMesh::basic_multiplex_target_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->targets_).
  super__Vector_base<OpenMesh::basic_multiplex_target_*,_std::allocator<OpenMesh::basic_multiplex_target_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->targets_).
  super__Vector_base<OpenMesh::basic_multiplex_target_*,_std::allocator<OpenMesh::basic_multiplex_target_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->target_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->target_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->target_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->target_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->target_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->target_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  (this->buffer_)._M_string_length = 0;
  (this->buffer_).field_2._M_local_buf[0] = '\0';
  this->enabled_ = true;
  std::__cxx11::string::reserve((ulong)&this->buffer_);
  return;
}

Assistant:

multiplex_streambuf() : enabled_(true) { buffer_.reserve(100); }